

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stmt.h
# Opt level: O0

void __thiscall
enact::StructStmt::StructStmt
          (StructStmt *this,Token *name,
          vector<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_> *fields)

{
  vector<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_> *fields_local;
  Token *name_local;
  StructStmt *this_local;
  
  Stmt::Stmt(&this->super_Stmt);
  (this->super_Stmt)._vptr_Stmt = (_func_int **)&PTR__StructStmt_0016a020;
  Token::Token(&this->name,name);
  std::vector<enact::StructStmt::Field,_std::allocator<enact::StructStmt::Field>_>::vector
            (&this->fields,fields);
  return;
}

Assistant:

StructStmt(Token name, std::vector<Field>&& fields) :
                name{std::move(name)},
                fields{std::move(fields)} {}